

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O1

NaPNEvent __thiscall NaPetriNet::step_alive(NaPetriNet *this,bool bDoPrintouts)

{
  NaPNodePtrAr *pNVar1;
  FILE *__stream;
  NaPetriNode *pNVar2;
  NaDataFile *pNVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  NaPNEvent NVar8;
  long lVar9;
  undefined4 extraout_var;
  char *pcVar10;
  size_t sVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  NaPetriConnector *pNVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  NaPNEvent NVar13;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  double dVar22;
  size_t local_40;
  int local_34;
  
  bVar18 = bDoPrintouts | this->bStepPrintout;
  if (bVar18 == 1) {
    NaPrintLog("# net \'%s\', step phases 7, 8, 9.\n",this->szName);
  }
  if (this->dfTimeChart != (NaDataFile *)0x0) {
    (*this->dfTimeChart->_vptr_NaDataFile[6])();
    iVar15 = this->iPrevIndex;
    iVar6 = (*this->pTimer->_vptr_NaTimer[5])();
    uVar21 = 0;
    if (iVar15 != iVar6) {
      uVar21 = 0x3fe999999999999a;
    }
    (*this->dfTimeChart->_vptr_NaDataFile[2])(uVar21,this->dfTimeChart,0);
  }
  if (bVar18 != 0) {
    NaPrintLog("----------------------------------------\n");
  }
  if (((FILE *)this->fpMap != (FILE *)0x0) && (lVar9 = ftell((FILE *)this->fpMap), lVar9 == 0)) {
    if (0 < (this->pnaNet).nItems) {
      iVar15 = 0;
      do {
        fwrite("==",2,1,(FILE *)this->fpMap);
        iVar15 = iVar15 + 1;
      } while (iVar15 < (this->pnaNet).nItems);
    }
    pNVar1 = &this->pnaNet;
    fputc(10,(FILE *)this->fpMap);
    if ((this->pnaNet).nItems < 1) {
      local_40._0_4_ = 0;
    }
    else {
      uVar17 = 0;
      local_40 = 0;
      do {
        iVar15 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        pcVar10 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var,iVar15));
        sVar11 = strlen(pcVar10);
        if ((ulong)(long)(int)local_40 < sVar11) {
          iVar15 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
          pcVar10 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_00,iVar15));
          local_40 = strlen(pcVar10);
        }
        uVar16 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar16;
      } while ((int)uVar16 < (this->pnaNet).nItems);
    }
    if (0 < (int)local_40) {
      iVar15 = 0;
      do {
        if (0 < (this->pnaNet).nItems) {
          uVar17 = 0;
          do {
            iVar6 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,uVar17);
            pcVar10 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_01,iVar6));
            sVar11 = strlen(pcVar10);
            __stream = (FILE *)this->fpMap;
            if ((int)sVar11 + iVar15 < (int)local_40) {
              fwrite("  ",2,1,__stream);
            }
            else {
              iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
              pcVar10 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_02,iVar6));
              fprintf(__stream," %c",
                      (ulong)(uint)(int)pcVar10[(int)sVar11 + (iVar15 - (int)local_40)]);
            }
            uVar16 = (int)uVar17 + 1;
            uVar17 = (ulong)uVar16;
          } while ((int)uVar16 < (this->pnaNet).nItems);
        }
        fputc(10,(FILE *)this->fpMap);
        iVar15 = iVar15 + 1;
      } while (iVar15 != (int)local_40);
    }
    if (0 < (this->pnaNet).nItems) {
      iVar15 = 0;
      do {
        fwrite("--",2,1,(FILE *)this->fpMap);
        iVar15 = iVar15 + 1;
      } while (iVar15 < (this->pnaNet).nItems);
    }
    fputc(10,(FILE *)this->fpMap);
  }
  bVar20 = false;
  if ((this->pnaNet).nItems < 1) {
    bVar19 = true;
  }
  else {
    pNVar1 = &this->pnaNet;
    uVar17 = 0;
    iVar15 = 0;
    local_34 = 0;
    do {
      uVar16 = (uint)uVar17;
      iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
      pNVar2 = *(NaPetriNode **)CONCAT44(extraout_var_03,iVar6);
      iVar6 = NaPetriNode::connectors(pNVar2);
      if (iVar6 == 0) {
        if ((bVar18 == 0) && (iVar6 = (*pNVar2->_vptr_NaPetriNode[3])(pNVar2), (char)iVar6 == '\0'))
        {
          cVar4 = '\0';
        }
        else {
          pcVar10 = NaPetriNode::name(pNVar2);
          cVar4 = '\0';
          NaPrintLog("node \'%s\' does not have connectors: skip it.\n",pcVar10);
        }
      }
      else {
        if ((bVar18 != 0) || (iVar6 = (*pNVar2->_vptr_NaPetriNode[3])(pNVar2), (char)iVar6 != '\0'))
        {
          pcVar10 = NaPetriNode::name(pNVar2);
          NaPrintLog("node \'%s\' try to activate.\n",pcVar10);
        }
        iVar6 = (*pNVar2->_vptr_NaPetriNode[0x11])(pNVar2);
        cVar4 = (char)iVar6;
        pNVar2->nCalls = pNVar2->nCalls + 1;
        if ((bVar18 != 0) || (iVar6 = (*pNVar2->_vptr_NaPetriNode[3])(pNVar2), (char)iVar6 != '\0'))
        {
          pcVar10 = NaPetriNode::name(pNVar2);
          pcVar14 = "not ";
          if (cVar4 != '\0') {
            pcVar14 = "";
          }
          NaPrintLog("node \'%s\' is %sactivated.\n",pcVar10,pcVar14);
        }
      }
      if ((FILE *)this->fpMap != (FILE *)0x0) {
        pcVar10 = "  ";
        if (cVar4 != '\0') {
          pcVar10 = " a";
        }
        fwrite(pcVar10,2,1,(FILE *)this->fpMap);
      }
      if (cVar4 != '\0') {
        iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        pNVar2 = *(NaPetriNode **)CONCAT44(extraout_var_04,iVar6);
        if ((bVar18 != 0) || (iVar6 = (*pNVar2->_vptr_NaPetriNode[3])(pNVar2), (char)iVar6 != '\0'))
        {
          pcVar10 = NaPetriNode::name(pNVar2);
          NaPrintLog("node \'%s\' action.\n",pcVar10);
        }
        iVar6 = (*pNVar2->_vptr_NaPetriNode[3])(pNVar2);
        if ((char)iVar6 != '\0') {
          pcVar10 = NaPetriNode::name(pNVar2);
          NaPrintLog("node \'%s\', input data:\n",pcVar10);
          for (iVar6 = 0; iVar7 = NaPetriNode::connectors(pNVar2), iVar6 < iVar7; iVar6 = iVar6 + 1)
          {
            pNVar12 = NaPetriNode::connector(pNVar2,iVar6);
            iVar7 = (*pNVar12->_vptr_NaPetriConnector[2])(pNVar12);
            if (0 < iVar7) {
              pNVar12 = NaPetriNode::connector(pNVar2,iVar6);
              iVar7 = (*pNVar12->_vptr_NaPetriConnector[7])(pNVar12);
              if (iVar7 == 0) {
                pNVar12 = NaPetriNode::connector(pNVar2,iVar6);
                pcVar10 = NaPetriConnector::name(pNVar12);
                NaPrintLog("  #%d \'%s\': ",(ulong)(iVar6 + 1),pcVar10);
                pNVar12 = NaPetriNode::connector(pNVar2,iVar6);
                iVar7 = (*pNVar12->_vptr_NaPetriConnector[8])(pNVar12);
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0xf8))
                          ((long *)CONCAT44(extraout_var_05,iVar7));
              }
            }
          }
        }
        (*pNVar2->_vptr_NaPetriNode[0x12])(pNVar2);
        iVar6 = (*pNVar2->_vptr_NaPetriNode[3])(pNVar2);
        if ((char)iVar6 != '\0') {
          pcVar10 = NaPetriNode::name(pNVar2);
          NaPrintLog("node \'%s\', output data:\n",pcVar10);
          for (iVar6 = 0; iVar7 = NaPetriNode::connectors(pNVar2), iVar6 < iVar7; iVar6 = iVar6 + 1)
          {
            pNVar12 = NaPetriNode::connector(pNVar2,iVar6);
            iVar7 = (*pNVar12->_vptr_NaPetriConnector[2])(pNVar12);
            if (0 < iVar7) {
              pNVar12 = NaPetriNode::connector(pNVar2,iVar6);
              iVar7 = (*pNVar12->_vptr_NaPetriConnector[7])(pNVar12);
              if (iVar7 == 1) {
                pNVar12 = NaPetriNode::connector(pNVar2,iVar6);
                pcVar10 = NaPetriConnector::name(pNVar12);
                NaPrintLog("  #%d \'%s\': ",(ulong)(iVar6 + 1),pcVar10);
                pNVar12 = NaPetriNode::connector(pNVar2,iVar6);
                iVar7 = (*pNVar12->_vptr_NaPetriConnector[8])(pNVar12);
                (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0xf8))
                          ((long *)CONCAT44(extraout_var_06,iVar7));
              }
            }
          }
        }
        pNVar2->nActivations = pNVar2->nActivations + 1;
        iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        if (*(NaPetriNode **)CONCAT44(extraout_var_07,iVar6) == this->pTimingNode) {
          (*this->pTimer->_vptr_NaTimer[3])();
        }
        iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        pNVar2 = *(NaPetriNode **)CONCAT44(extraout_var_08,iVar6);
        if ((bVar18 != 0) || (iVar6 = (*pNVar2->_vptr_NaPetriNode[3])(pNVar2), (char)iVar6 != '\0'))
        {
          pcVar10 = NaPetriNode::name(pNVar2);
          NaPrintLog("node \'%s\' post action.\n",pcVar10);
        }
        (*pNVar2->_vptr_NaPetriNode[0x13])(pNVar2);
        local_34 = local_34 + 1;
        iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        iVar15 = iVar15 + (uint)*(byte *)(*(long *)CONCAT44(extraout_var_09,iVar6) + 0x38);
      }
      if (bVar18 == 0) {
        iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        cVar5 = (**(code **)(**(long **)CONCAT44(extraout_var_10,iVar6) + 0x18))();
        if (cVar5 != '\0') goto LAB_001460be;
      }
      else {
LAB_001460be:
        iVar6 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,uVar17);
        (**(code **)(**(long **)CONCAT44(extraout_var_11,iVar6) + 0x38))();
      }
      pNVar3 = this->dfTimeChart;
      if (pNVar3 != (NaDataFile *)0x0) {
        dVar22 = (double)(int)~uVar16 + 0.8;
        if (cVar4 == '\0') {
          dVar22 = (double)(int)~uVar16;
        }
        (*pNVar3->_vptr_NaDataFile[2])(dVar22,pNVar3,(ulong)(uVar16 + 1));
      }
      uVar17 = (ulong)(uVar16 + 1);
    } while ((int)(uVar16 + 1) < (this->pnaNet).nItems);
    bVar19 = local_34 == 0;
    bVar20 = iVar15 != 0;
  }
  if ((FILE *)this->fpMap != (FILE *)0x0) {
    fputc(10,(FILE *)this->fpMap);
  }
  NVar13 = pneHalted;
  if (!bVar20) {
    NVar13 = (bUserBreak & 1) * 3;
  }
  NVar8 = pneDead;
  if (!bVar19) {
    NVar8 = NVar13;
  }
  return NVar8;
}

Assistant:

NaPNEvent
NaPetriNet::step_alive (bool bDoPrintouts)
{
    int     iNode;
    int     nHalted = 0;
    int     iActive = 0;

    if(bStepPrintout)
      bDoPrintouts = bStepPrintout;

    if(bDoPrintouts){
        NaPrintLog("# net '%s', step phases 7, 8, 9.\n", name());
    }

    // Add point to timechart
    if(NULL != dfTimeChart){
        dfTimeChart->AppendRecord();

        // Time track
        if(iPrevIndex == timer().CurrentIndex()){
            dfTimeChart->SetValue(0.0/* old */, 0/* time */);
        }else{
            dfTimeChart->SetValue(0.8/* new */, 0/* time */);
        }
    }

    if(bDoPrintouts)
      NaPrintLog("----------------------------------------\n");

    if(NULL != fpMap){
      if(0 == ftell(fpMap)){

	/* print line */
	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  fprintf(fpMap, "==");
	}/* iNode */
	fputc('\n', fpMap);

	/* compute max length among names */
	int	nMaxLen = 0;

	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  if(strlen(pnaNet[iNode]->name()) > nMaxLen){
	    nMaxLen = strlen(pnaNet[iNode]->name());
	  }
	}/* iNode */

	int	iLine;

	/* print header */
	for(iLine = 0; iLine < nMaxLen; ++iLine){
	  for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	    int	iNameLen = strlen(pnaNet[iNode]->name());
	    if(iNameLen + iLine >= nMaxLen){
	      fprintf(fpMap, " %c",
		      pnaNet[iNode]->name()[iLine - (nMaxLen - iNameLen)]);
	    }else{
	      fprintf(fpMap, "  ");
	    }
	  }/* iNode */
	  fputc('\n', fpMap);
	}/* iLine */

	/* print line */
	for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	  fprintf(fpMap, "--");
	}/* iNode */
	fputc('\n', fpMap);

      }/* for the first time */
    }/* activation map */

    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
      bool    bActivate = false;

      try{
	NaPetriNode &node = *pnaNet[iNode];

	// 7. Do one step of node activity and return true if succeeded
	if(0 == node.connectors()) {
	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' does not have connectors: skip it.\n",
			   node.name());
	    }
	}
	else {
	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' try to activate.\n",
			   node.name());
	    }

	    bActivate = node.activate();

	    // Count calls
	    ++node.nCalls;

	    if(bDoPrintouts || node.is_verbose()){
		NaPrintLog("node '%s' is %sactivated.\n",
			   node.name(), bActivate?"" :"not ");
	    }
	}
      }catch(NaException exCode){
	NaPrintLog("Step of node activity phase (#7): node '%s' fault.\n"
		   "Caused by exception: %s\n",
		   pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	bActivate = false;
      }

      /* activation map */
      if(NULL != fpMap){
	if(bActivate){
	  fprintf(fpMap, " a");
	}else{
	  fprintf(fpMap, "  ");
	}
      }/* activation map */

      if(bActivate){
	++iActive;

	try{
	  NaPetriNode &node = *pnaNet[iNode];

	  // 8. True action of the node (if activate returned true)
	  if(bDoPrintouts || node.is_verbose()){
	    NaPrintLog("node '%s' action.\n", node.name());
	  }

	  // Print contents of linked inputs
	  if(node.is_verbose()){
            int	iCn;

            NaPrintLog("node '%s', input data:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
	      if(node.connector(iCn)->links() > 0 &&
		 node.connector(iCn)->kind() == pckInput){
		// Only used input connectors
                NaPrintLog("  #%d '%s': ",
			   iCn + 1, node.connector(iCn)->name());
		node.connector(iCn)->data().print_contents();
	      }
            }
	  }

	  node.action();

	  // Print contents of linked outputs
	  if(node.is_verbose()){
            int	iCn;

            NaPrintLog("node '%s', output data:\n", node.name());
            for(iCn = 0; iCn < node.connectors(); ++iCn){
	      if(node.connector(iCn)->links() > 0 &&
		 node.connector(iCn)->kind() == pckOutput){
		// Only used output connectors
                NaPrintLog("  #%d '%s': ",
			   iCn + 1, node.connector(iCn)->name());
		node.connector(iCn)->data().print_contents();
	      }
            }
	  }

	  // Count activations
	  ++node.nActivations;

	  // Node is timing one - let's update timer
	  if(pnaNet[iNode] == pTimingNode)
	      timer().GoNextTime();

	}catch(NaException exCode){
	  NaPrintLog("True action phase (#8): node '%s' fault.\n"
		     "Caused by exception: %s\n",
		     pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	}

	try{
	  NaPetriNode &node = *pnaNet[iNode];

	  // 9. Finish data processing by the node (if activate
	  //    returned true)
	  if(bDoPrintouts || node.is_verbose()){
	    NaPrintLog("node '%s' post action.\n",
		       node.name());
	  }
	  node.post_action();
	}catch(NaException exCode){
	  NaPrintLog("Postaction phase (#9): node '%s' fault.\n"
		     "Caused by exception: %s\n",
		     pnaNet[iNode]->name(), NaExceptionMsg(exCode));
	}

	// Check for internal halt
	if(pnaNet[iNode]->bHalt){
	  ++nHalted;
	}
      }

      try{
	if(bDoPrintouts || pnaNet[iNode]->is_verbose()){
	  pnaNet[iNode]->describe();
	}
      }catch(NaException exCode){
	// Skip...
      }

      // Add node point to time chart
      if(NULL != dfTimeChart){
	if(bActivate){
	  dfTimeChart->SetValue(-(1 + iNode) + 0.8/* active */, 1+iNode);
	}else{
	  dfTimeChart->SetValue(-(1 + iNode)/* passive */, 1+iNode);
	}
      }
    }

    /* activation map */
    if(NULL != fpMap){
      fputc('\n', fpMap);
    }

    //// Add point to timechart
    //if(NULL != dfTimeChart){
    //    dfTimeChart->AppendRecord();
    //
    //    // Time track
    //    dfTimeChart->SetValue(0.0/* old */, 0/* time */);
    //}

    if(0 == iActive){
        return pneDead;
    }else if(0 != nHalted){
        return pneHalted;
    }

#if defined(unix)
    if(bUserBreak)
      return pneTerminate;
#endif /* unix */

    return pneAlive;
}